

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

shared_ptr<Expr> __thiscall Parser::term(Parser *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Parser *in_RSI;
  shared_ptr<Expr> sVar3;
  shared_ptr<Token> tok;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Arith,_(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  sVar3 = unary(this);
  _Var2 = sVar3.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  while ((iVar1 = ((in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tag
         , iVar1 == 0x2f || (iVar1 == 0x2a))) {
    std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,&(in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>);
    move(in_RSI);
    unary((Parser *)&stack0xffffffffffffffa0);
    std::make_shared<Arith,std::shared_ptr<Token>&,std::shared_ptr<Expr>&,std::shared_ptr<Expr>>
              ((shared_ptr<Token> *)&local_40,(shared_ptr<Expr> *)&local_50,(shared_ptr<Expr> *)this
              );
    std::__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2> *)this,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Expr>)sVar3.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> term() {
		std::shared_ptr<Expr> x = unary();
		while (look->tag == '*' || look->tag == '/') {
			std::shared_ptr<Token> tok = look; move();
			x = std::make_shared<Arith>(tok, x, unary());
		}
		return x;
	}